

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int lws_http_to_fallback(lws *wsi,uchar *obuf,size_t olen)

{
  byte bVar1;
  uint8_t uVar2;
  lws_vhost *plVar3;
  lws_protocols *plVar4;
  int iVar5;
  uint uVar6;
  lws_role_ops *plVar7;
  lws_protocols *plVar8;
  byte bVar9;
  uint8_t uVar10;
  char *pcVar11;
  lws_protocols *p;
  lws_role_ops *ops;
  char ipbuf [64];
  
  plVar3 = (wsi->a).vhost;
  bVar1 = plVar3->raw_protocol_index;
  plVar4 = plVar3->protocols;
  ops = &role_ops_raw_skt;
  if (plVar3->listen_accept_role != (char *)0x0) {
    plVar7 = lws_role_by_name(plVar3->listen_accept_role);
    if (plVar7 != (lws_role_ops *)0x0) {
      ops = lws_role_by_name(((wsi->a).vhost)->listen_accept_role);
    }
  }
  plVar3 = (wsi->a).vhost;
  pcVar11 = plVar3->listen_accept_protocol;
  p = plVar4 + bVar1;
  if (pcVar11 != (char *)0x0) {
    plVar8 = lws_vhost_name_to_protocol(plVar3,pcVar11);
    if (plVar8 != (lws_protocols *)0x0) {
      p = plVar8;
    }
  }
  lws_bind_protocol(wsi,p,"lws_http_to_fallback");
  lws_role_transition(wsi,0x20000000,LRS_ESTABLISHED,ops);
  lws_header_table_detach(wsi,0);
  lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
  bVar1 = wsi->role_ops->adoption_cb[1];
  bVar9 = 0x13;
  if (bVar1 != 0) {
    bVar9 = bVar1;
  }
  ipbuf[0] = '\0';
  lws_get_peer_simple(wsi,ipbuf,0x40);
  if (ops == (lws_role_ops *)0x0) {
    pcVar11 = "null";
  }
  else {
    pcVar11 = ops->name;
  }
  _lws_log(4,"%s: vh %s, peer: %s, role %s, protocol %s, cb %d, ah %p\n","lws_http_to_fallback",
           ((wsi->a).vhost)->name,ipbuf,pcVar11,p->name,(ulong)bVar9,(wsi->http).ah);
  iVar5 = (*((wsi->a).protocol)->callback)
                    (wsi,(lws_callback_reasons)bVar9,wsi->user_space,(void *)0x0,0);
  uVar6 = 1;
  if (iVar5 == 0) {
    uVar2 = wsi->role_ops->rx_cb[(wsi->wsistate >> 0x1d & 1) != 0];
    uVar10 = ';';
    if (uVar2 != '\0') {
      uVar10 = uVar2;
    }
    iVar5 = (*((wsi->a).protocol)->callback)
                      (wsi,(lws_callback_reasons)uVar10,wsi->user_space,obuf,olen);
    uVar6 = (uint)(iVar5 != 0);
  }
  return uVar6;
}

Assistant:

int
lws_http_to_fallback(struct lws *wsi, unsigned char *obuf, size_t olen)
{
	const struct lws_role_ops *role = &role_ops_raw_skt;
	const struct lws_protocols *p1, *protocol =
			 &wsi->a.vhost->protocols[wsi->a.vhost->raw_protocol_index];
	char ipbuf[64];
	int n;

	if (wsi->a.vhost->listen_accept_role &&
	    lws_role_by_name(wsi->a.vhost->listen_accept_role))
		role = lws_role_by_name(wsi->a.vhost->listen_accept_role);

	if (wsi->a.vhost->listen_accept_protocol) {
		p1 = lws_vhost_name_to_protocol(wsi->a.vhost,
			    wsi->a.vhost->listen_accept_protocol);
		if (p1)
			protocol = p1;
	}

	lws_bind_protocol(wsi, protocol, __func__);

	lws_role_transition(wsi, LWSIFR_SERVER, LRS_ESTABLISHED, role);

	lws_header_table_detach(wsi, 0);
	lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

	n = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
	if (wsi->role_ops->adoption_cb[1])
		n = wsi->role_ops->adoption_cb[1];

	ipbuf[0] = '\0';
#if !defined(LWS_PLAT_OPTEE)
	lws_get_peer_simple(wsi, ipbuf, sizeof(ipbuf));
#endif

	lwsl_notice("%s: vh %s, peer: %s, role %s, "
		    "protocol %s, cb %d, ah %p\n", __func__, wsi->a.vhost->name,
		    ipbuf, role ? role->name : "null", protocol->name, n,
		    wsi->http.ah);

	if ((wsi->a.protocol->callback)(wsi, (enum lws_callback_reasons)n, wsi->user_space, NULL, 0))
		return 1;

	n = LWS_CALLBACK_RAW_RX;
	if (wsi->role_ops->rx_cb[lwsi_role_server(wsi)])
		n = wsi->role_ops->rx_cb[lwsi_role_server(wsi)];
	if (wsi->a.protocol->callback(wsi, (enum lws_callback_reasons)n, wsi->user_space, obuf, olen))
		return 1;

	return 0;
}